

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCube_GL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureCube_GL::UpdateData
          (TextureCube_GL *this,GLContextState *ContextState,Uint32 MipLevel,Uint32 Slice,
          Box *DstBox,TextureSubResData *SubresData)

{
  uint uVar1;
  GLint GVar2;
  GLint GVar3;
  GLenum GVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC p_Var9;
  GLenum GVar10;
  GLContextState *this_00;
  Uint32 UVar11;
  Uint32 UVar12;
  int iVar13;
  Uint32 UVar14;
  GLBufferObj *this_01;
  uint *puVar15;
  Char *pCVar16;
  TextureFormatAttribs *pTVar17;
  NativePixelAttribs NVar18;
  char (*in_stack_fffffffffffffdd8) [2];
  undefined4 uVar19;
  void *local_1e8;
  void *local_1b8;
  GLTextureObj local_16c;
  undefined1 local_160 [8];
  string msg_3;
  ulong uStack_138;
  GLenum err;
  undefined1 local_130 [8];
  string msg_2;
  Uint32 PixelSize;
  TextureFormatAttribs *TexFmtInfo;
  uint local_f8;
  uint local_f4;
  Uint32 local_f0;
  Uint32 local_ec;
  Uint32 UpdateRegionHeight;
  Uint32 UpdateRegionWidth;
  string msg_1;
  Uint32 BlockBytesInRow;
  TextureFormatAttribs *FmtAttribs;
  undefined1 local_a8 [8];
  string msg;
  uint local_7c;
  uint MipHeight;
  uint local_74;
  undefined8 uStack_70;
  uint MipWidth;
  undefined1 local_68;
  undefined8 local_5c;
  undefined1 local_54;
  undefined8 *local_50;
  NativePixelAttribs *TransferAttribs;
  BufferGLImpl *pBufferGL;
  GLuint UnpackBuffer;
  GLenum CubeMapFaceBindTarget;
  TextureSubResData *SubresData_local;
  Box *DstBox_local;
  Uint32 Slice_local;
  Uint32 MipLevel_local;
  GLContextState *ContextState_local;
  TextureCube_GL *this_local;
  
  _UnpackBuffer = SubresData;
  SubresData_local = (TextureSubResData *)DstBox;
  DstBox_local._0_4_ = Slice;
  DstBox_local._4_4_ = MipLevel;
  _Slice_local = ContextState;
  ContextState_local = (GLContextState *)this;
  TextureBaseGL::UpdateData
            (&this->super_TextureBaseGL,ContextState,MipLevel,Slice,DstBox,SubresData);
  GLContextState::BindTexture
            (_Slice_local,-1,(this->super_TextureBaseGL).m_BindTarget,
             &(this->super_TextureBaseGL).m_GlTexture);
  pBufferGL._4_4_ = GetCubeMapFaceBindTarget((Uint32)DstBox_local);
  pBufferGL._0_4_ = 0;
  if (_UnpackBuffer->pSrcBuffer != (IBuffer *)0x0) {
    TransferAttribs =
         (NativePixelAttribs *)
         ClassPtrCast<Diligent::BufferGLImpl,Diligent::IBuffer>(_UnpackBuffer->pSrcBuffer);
    this_01 = BufferGLImpl::GetGLHandle((BufferGLImpl *)TransferAttribs);
    pBufferGL._0_4_ =
         GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)this_01);
  }
  (*__glewBindBuffer)(0x88ec,(GLuint)pBufferGL);
  NVar18 = GetNativePixelTransferAttribs
                     ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                      .m_Desc.Format);
  uStack_70 = NVar18._0_8_;
  local_68 = NVar18.IsCompressed;
  local_50 = &local_5c;
  local_5c = uStack_70;
  local_54 = local_68;
  glPixelStorei(0xcf5,4);
  glPixelStorei(0xcf4,0);
  glPixelStorei(0xcf3,0);
  if ((*(byte *)(local_50 + 1) & 1) == 0) {
    pTVar17 = GetTextureFormatAttribs
                        ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>
                         .
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         .m_Desc.Format);
    uVar19 = (undefined4)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    msg_2.field_2._12_4_ = (uint)pTVar17->NumComponents * (uint)pTVar17->ComponentSize;
    if (_UnpackBuffer->Stride % (ulong)(uint)msg_2.field_2._12_4_ != 0) {
      FormatString<char[42]>
                ((string *)local_130,(char (*) [42])"Data stride is not multiple of pixel size");
      pCVar16 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar16,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                 ,0xe6);
      std::__cxx11::string::~string((string *)local_130);
    }
    uStack_138 = _UnpackBuffer->Stride / (ulong)(uint)msg_2.field_2._12_4_;
    iVar13 = StaticCast<int,unsigned_long>(&stack0xfffffffffffffec8);
    glPixelStorei(0xcf2,iVar13);
    UVar11 = DstBox_local._4_4_;
    GVar4 = pBufferGL._4_4_;
    uVar5 = *(undefined4 *)&SubresData_local->pData;
    uVar6 = *(undefined4 *)&SubresData_local->pSrcBuffer;
    UVar14 = Box::Width((Box *)SubresData_local);
    UVar12 = Box::Height((Box *)SubresData_local);
    uVar7 = *(undefined4 *)local_50;
    uVar8 = *(undefined4 *)((long)local_50 + 4);
    if (_UnpackBuffer->pSrcBuffer == (IBuffer *)0x0) {
      local_1e8 = _UnpackBuffer->pData;
    }
    else {
      local_1e8 = (void *)StaticCast<unsigned_long,unsigned_long>(&_UnpackBuffer->SrcOffset);
    }
    glTexSubImage2D(GVar4,UVar11,uVar5,uVar6,UVar14,UVar12,CONCAT44(uVar19,uVar7),uVar8,local_1e8);
  }
  else {
    MipHeight = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                .m_Desc.Width >> ((byte)DstBox_local._4_4_ & 0x1f);
    local_7c = 1;
    puVar15 = std::max<unsigned_int>(&MipHeight,&local_7c);
    local_74 = *puVar15;
    msg.field_2._12_4_ =
         (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
         .m_Desc.Height >> ((byte)DstBox_local._4_4_ & 0x1f);
    msg.field_2._8_4_ = 1;
    puVar15 = std::max<unsigned_int>
                        ((uint *)(msg.field_2._M_local_buf + 0xc),
                         (uint *)(msg.field_2._M_local_buf + 8));
    uVar1 = *puVar15;
    if ((((((ulong)SubresData_local->pData & 3) != 0) ||
         (((ulong)SubresData_local->pSrcBuffer & 3) != 0)) ||
        ((((ulong)SubresData_local->pData & 0x300000000) != 0 &&
         (*(uint *)((long)&SubresData_local->pData + 4) != local_74)))) ||
       ((((ulong)SubresData_local->pSrcBuffer & 0x300000000) != 0 &&
        (*(uint *)((long)&SubresData_local->pSrcBuffer + 4) != uVar1)))) {
      FormatString<char[57]>
                ((string *)local_a8,
                 (char (*) [57])"Compressed texture update region must be 4 pixel-aligned");
      pCVar16 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar16,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                 ,0xbb);
      std::__cxx11::string::~string((string *)local_a8);
    }
    pTVar17 = GetTextureFormatAttribs
                        ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>
                         .
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         .m_Desc.Format);
    UVar11 = Box::Width((Box *)SubresData_local);
    msg_1.field_2._12_4_ = (UVar11 + 3 >> 2) * (uint)pTVar17->ComponentSize;
    if (_UnpackBuffer->Stride != (ulong)(uint)msg_1.field_2._12_4_) {
      FormatString<char[25],unsigned_long,char[53],unsigned_int,char[2]>
                ((string *)&UpdateRegionHeight,(Diligent *)"Compressed data stride (",
                 (char (*) [25])&_UnpackBuffer->Stride,
                 (unsigned_long *)" must match the size of a row of compressed blocks (",
                 (char (*) [53])((long)&msg_1.field_2 + 0xc),(uint *)0x46d916,
                 in_stack_fffffffffffffdd8);
      pCVar16 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar16,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                 ,0xc2);
      std::__cxx11::string::~string((string *)&UpdateRegionHeight);
    }
    glPixelStorei(0xcf2,0);
    local_ec = Box::Width((Box *)SubresData_local);
    local_f0 = Box::Height((Box *)SubresData_local);
    local_f4 = local_74 - *(int *)&SubresData_local->pData;
    puVar15 = std::min<unsigned_int>(&local_ec,&local_f4);
    local_ec = *puVar15;
    local_f8 = uVar1 - *(int *)&SubresData_local->pSrcBuffer;
    puVar15 = std::min<unsigned_int>(&local_f0,&local_f8);
    UVar14 = DstBox_local._4_4_;
    GVar10 = pBufferGL._4_4_;
    UVar11 = local_ec;
    p_Var9 = __glewCompressedTexSubImage2D;
    uVar1 = *puVar15;
    GVar2 = *(GLint *)&SubresData_local->pData;
    GVar3 = *(GLint *)&SubresData_local->pSrcBuffer;
    GVar4 = (this->super_TextureBaseGL).m_GLTexFormat;
    local_f0 = uVar1;
    UVar12 = Box::Height((Box *)SubresData_local);
    TexFmtInfo = (TextureFormatAttribs *)((ulong)(UVar12 + 3 >> 2) * _UnpackBuffer->Stride);
    iVar13 = StaticCast<int,unsigned_long>((unsigned_long *)&TexFmtInfo);
    if (_UnpackBuffer->pSrcBuffer == (IBuffer *)0x0) {
      local_1b8 = _UnpackBuffer->pData;
    }
    else {
      local_1b8 = (void *)StaticCast<unsigned_long,unsigned_long>(&_UnpackBuffer->SrcOffset);
    }
    (*p_Var9)(GVar10,UVar14,GVar2,GVar3,UVar11,uVar1,GVar4,iVar13,local_1b8);
  }
  msg_3.field_2._12_4_ = glGetError();
  if (msg_3.field_2._12_4_ != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0xf6,(char (*) [31])"Failed to update subimage data",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg_3.field_2._M_local_buf + 0xc));
    FormatString<char[6]>((string *)local_160,(char (*) [6])0x4585f6);
    pCVar16 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar16,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)local_160);
  }
  if ((GLuint)pBufferGL != 0) {
    (*__glewBindBuffer)(0x88ec,0);
  }
  this_00 = _Slice_local;
  GVar4 = (this->super_TextureBaseGL).m_BindTarget;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::Null();
  GLContextState::BindTexture(this_00,-1,GVar4,&local_16c);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
            (&local_16c);
  return;
}

Assistant:

void TextureCube_GL::UpdateData(GLContextState&          ContextState,
                                Uint32                   MipLevel,
                                Uint32                   Slice,
                                const Box&               DstBox,
                                const TextureSubResData& SubresData)
{
    TextureBaseGL::UpdateData(ContextState, MipLevel, Slice, DstBox, SubresData);

    // Texture must be bound as GL_TEXTURE_CUBE_MAP, but glTexSubImage2D()
    // then takes one of GL_TEXTURE_CUBE_MAP_POSITIVE_X ... GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
    ContextState.BindTexture(-1, m_BindTarget, m_GlTexture);

    auto CubeMapFaceBindTarget = GetCubeMapFaceBindTarget(Slice);

    // Bind buffer if it is provided; copy from CPU memory otherwise
    GLuint UnpackBuffer = 0;
    if (SubresData.pSrcBuffer != nullptr)
    {
        auto* pBufferGL = ClassPtrCast<BufferGLImpl>(SubresData.pSrcBuffer);
        UnpackBuffer    = pBufferGL->GetGLHandle();
    }

    // Transfers to OpenGL memory are called unpack operations
    // If there is a buffer bound to GL_PIXEL_UNPACK_BUFFER target, then all the pixel transfer
    // operations will be performed from this buffer.
    glBindBuffer(GL_PIXEL_UNPACK_BUFFER, UnpackBuffer);

    const auto& TransferAttribs = GetNativePixelTransferAttribs(m_Desc.Format);

    glPixelStorei(GL_UNPACK_ALIGNMENT, PBOOffsetAlignment);
    glPixelStorei(GL_UNPACK_SKIP_PIXELS, 0);
    glPixelStorei(GL_UNPACK_SKIP_ROWS, 0);

    if (TransferAttribs.IsCompressed)
    {
        auto MipWidth  = std::max(m_Desc.Width >> MipLevel, 1U);
        auto MipHeight = std::max(m_Desc.Height >> MipLevel, 1U);
        // clang-format off
        VERIFY((DstBox.MinX % 4) == 0 && (DstBox.MinY % 4) == 0 &&
               ((DstBox.MaxX % 4) == 0 || DstBox.MaxX == MipWidth) &&
               ((DstBox.MaxY % 4) == 0 || DstBox.MaxY == MipHeight),
               "Compressed texture update region must be 4 pixel-aligned" );
        // clang-format on
#ifdef DILIGENT_DEBUG
        {
            const auto& FmtAttribs      = GetTextureFormatAttribs(m_Desc.Format);
            auto        BlockBytesInRow = ((DstBox.Width() + 3) / 4) * Uint32{FmtAttribs.ComponentSize};
            VERIFY(SubresData.Stride == BlockBytesInRow,
                   "Compressed data stride (", SubresData.Stride, " must match the size of a row of compressed blocks (", BlockBytesInRow, ")");
        }
#endif

        glPixelStorei(GL_UNPACK_ROW_LENGTH, 0); // Must be 0 on WebGL
        //glPixelStorei(GL_UNPACK_COMPRESSED_BLOCK_WIDTH, 0);

        // Texture must be bound as GL_TEXTURE_CUBE_MAP, but glCompressedTexSubImage2D()
        // takes one of GL_TEXTURE_CUBE_MAP_POSITIVE_X ... GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
        auto UpdateRegionWidth  = DstBox.Width();
        auto UpdateRegionHeight = DstBox.Height();
        UpdateRegionWidth       = std::min(UpdateRegionWidth, MipWidth - DstBox.MinX);
        UpdateRegionHeight      = std::min(UpdateRegionHeight, MipHeight - DstBox.MinY);
        glCompressedTexSubImage2D(CubeMapFaceBindTarget, MipLevel,
                                  DstBox.MinX,
                                  DstBox.MinY,
                                  UpdateRegionWidth,
                                  UpdateRegionHeight,
                                  // The format must be the same compressed-texture format previously
                                  // specified by glTexStorage2D() (thank you OpenGL for another useless
                                  // parameter that is nothing but the source of confusion), otherwise
                                  // INVALID_OPERATION error is generated.
                                  m_GLTexFormat,
                                  // An INVALID_VALUE error is generated if imageSize is not consistent with
                                  // the format, dimensions, and contents of the compressed image( too little or
                                  // too much data ),
                                  StaticCast<GLsizei>(((DstBox.Height() + 3) / 4) * SubresData.Stride),
                                  // If a non-zero named buffer object is bound to the GL_PIXEL_UNPACK_BUFFER target, 'data' is treated
                                  // as a byte offset into the buffer object's data store.
                                  // https://www.khronos.org/registry/OpenGL-Refpages/gl4/html/glCompressedTexSubImage2D.xhtml
                                  SubresData.pSrcBuffer != nullptr ? reinterpret_cast<void*>(StaticCast<size_t>(SubresData.SrcOffset)) : SubresData.pData);
    }
    else
    {
        const auto& TexFmtInfo = GetTextureFormatAttribs(m_Desc.Format);
        const auto  PixelSize  = Uint32{TexFmtInfo.NumComponents} * Uint32{TexFmtInfo.ComponentSize};
        VERIFY((SubresData.Stride % PixelSize) == 0, "Data stride is not multiple of pixel size");
        glPixelStorei(GL_UNPACK_ROW_LENGTH, StaticCast<GLint>(SubresData.Stride / PixelSize));

        // Texture must be bound as GL_TEXTURE_CUBE_MAP, but glTexSubImage2D()
        // takes one of GL_TEXTURE_CUBE_MAP_POSITIVE_X ... GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
        glTexSubImage2D(CubeMapFaceBindTarget, MipLevel,
                        DstBox.MinX,
                        DstBox.MinY,
                        DstBox.Width(),
                        DstBox.Height(),
                        TransferAttribs.PixelFormat, TransferAttribs.DataType,
                        // If a non-zero named buffer object is bound to the GL_PIXEL_UNPACK_BUFFER target, 'data' is treated
                        // as a byte offset into the buffer object's data store.
                        // https://www.khronos.org/registry/OpenGL-Refpages/gl4/html/glTexSubImage2D.xhtml
                        SubresData.pSrcBuffer != nullptr ? reinterpret_cast<void*>(StaticCast<size_t>(SubresData.SrcOffset)) : SubresData.pData);
    }
    DEV_CHECK_GL_ERROR("Failed to update subimage data");

    if (UnpackBuffer != 0)
        glBindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);

    ContextState.BindTexture(-1, m_BindTarget, GLObjectWrappers::GLTextureObj::Null());
}